

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O2

int Rwr_ManNodeVolume(Rwr_Man_t *p,Rwr_Node_t *p0,Rwr_Node_t *p1)

{
  uint in_EAX;
  int Volume;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  Rwr_ManIncTravId(p);
  Rwr_Trav_rec(p,p0,(int *)((long)&uStack_28 + 4));
  Rwr_Trav_rec(p,p1,(int *)((long)&uStack_28 + 4));
  return uStack_28._4_4_;
}

Assistant:

int Rwr_ManNodeVolume( Rwr_Man_t * p, Rwr_Node_t * p0, Rwr_Node_t * p1 )
{
    int Volume = 0;
    Rwr_ManIncTravId( p );
    Rwr_Trav_rec( p, p0, &Volume );
    Rwr_Trav_rec( p, p1, &Volume );
    return Volume;
}